

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void SetUserVariable(AActor *self,FName *varname,int index,int value)

{
  PClass *pPVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  PType *type;
  void *addr;
  PType *local_30;
  void *local_28;
  FName local_1c;
  
  local_1c = (FName)varname->Index;
  bVar2 = GetVarAddrType(self,&local_1c,index,&local_28,&local_30,false);
  pPVar1 = PFloat::RegistrationInfo.MyClass;
  if (!bVar2) {
    return;
  }
  if ((local_30->super_DObject).Class == (PClass *)0x0) {
    iVar3 = (**(local_30->super_DObject)._vptr_DObject)(local_30);
    (local_30->super_DObject).Class = (PClass *)CONCAT44(extraout_var,iVar3);
  }
  pPVar4 = (local_30->super_DObject).Class;
  bVar2 = pPVar4 != (PClass *)0x0;
  if (pPVar4 != pPVar1 && bVar2) {
    do {
      pPVar4 = pPVar4->ParentClass;
      bVar2 = pPVar4 != (PClass *)0x0;
      if (pPVar4 == pPVar1) break;
    } while (pPVar4 != (PClass *)0x0);
  }
  if (bVar2) {
    (*(local_30->super_DObject)._vptr_DObject[0xd])((double)value * 1.52587890625e-05,local_30);
    return;
  }
  (*(local_30->super_DObject)._vptr_DObject[0xc])(local_30,local_28,(ulong)(uint)value);
  return;
}

Assistant:

static void SetUserVariable(AActor *self, FName varname, int index, int value)
{
	void *addr;
	PType *type;

	if (GetVarAddrType(self, varname, index, addr, type, false))
	{
		if (!type->IsKindOf(RUNTIME_CLASS(PFloat)))
		{
			type->SetValue(addr, value);
		}
		else
		{
			type->SetValue(addr, ACSToDouble(value));
		}
	}
}